

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall
spvtools::opt::IRContext::InvalidateAnalyses(IRContext *this,Analysis analyses_to_invalidate)

{
  Analysis AVar1;
  Analysis AVar2;
  
  AVar2 = analyses_to_invalidate | (kAnalysisDebugInfo|kAnalysisConstants);
  if (-1 < (short)analyses_to_invalidate) {
    AVar2 = analyses_to_invalidate;
  }
  if ((AVar2 & kAnalysisBegin) != kAnalysisNone) {
    std::
    __uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             *)&this->def_use_mgr_,(pointer)0x0);
  }
  if ((AVar2 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    std::
    _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->instr_to_block_)._M_h);
  }
  if ((AVar2 & kAnalysisDecorations) != kAnalysisNone) {
    std::
    __uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             *)&this->decoration_mgr_,(pointer)0x0);
  }
  if ((AVar2 & kAnalysisCombinators) != kAnalysisNone) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->combinator_ops_)._M_h);
  }
  AVar1 = AVar2 * 2 & kAnalysisDominatorAnalysis;
  if ((AVar2 >> 0xc & 1) != 0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->builtin_var_id_map_)._M_h);
  }
  if ((AVar2 & kAnalysisCFG) != kAnalysisNone) {
    std::__uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::reset
              ((__uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_> *)
               &this->cfg_,(pointer)0x0);
  }
  if (AVar1 != kAnalysisNone || (AVar2 & kAnalysisDominatorAnalysis) != kAnalysisNone) {
    std::
    _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
    ::clear(&(this->dominator_trees_)._M_t);
    std::
    _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
    ::clear(&(this->post_dominator_trees_)._M_t);
  }
  if ((char)AVar2 < '\0') {
    std::
    __uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
             *)&this->id_to_name_,(pointer)0x0);
  }
  if ((AVar2 >> 10 & 1) != 0) {
    std::
    __uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
             *)&this->vn_table_,(pointer)0x0);
  }
  if ((AVar2 >> 0xb & 1) != 0) {
    std::
    __uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
             *)&this->struct_cfg_analysis_,(pointer)0x0);
  }
  if ((AVar2 >> 0xd & 1) != 0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->id_to_func_)._M_h);
  }
  if ((AVar2 >> 0xe & 1) != 0) {
    std::
    __uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
             *)&this->constant_mgr_,(pointer)0x0);
  }
  if ((AVar2 >> 0x11 & 1) != 0) {
    std::
    __uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
             *)&this->liveness_mgr_,(pointer)0x0);
  }
  if ((short)AVar2 < 0) {
    std::
    __uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
             *)&this->type_mgr_,(pointer)0x0);
  }
  if ((AVar2 >> 0x10 & 1) != 0) {
    std::
    __uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
             *)&this->debug_info_mgr_,(pointer)0x0);
  }
  this->valid_analyses_ = this->valid_analyses_ & ~(AVar1 | AVar2);
  return;
}

Assistant:

void IRContext::InvalidateAnalyses(IRContext::Analysis analyses_to_invalidate) {
  // The ConstantManager and DebugInfoManager contain Type pointers. If the
  // TypeManager goes away, the ConstantManager and DebugInfoManager have to
  // go away.
  if (analyses_to_invalidate & kAnalysisTypes) {
    analyses_to_invalidate |= kAnalysisConstants;
    analyses_to_invalidate |= kAnalysisDebugInfo;
  }

  // The dominator analysis hold the pseudo entry and exit nodes from the CFG.
  // Also if the CFG change the dominators many changed as well, so the
  // dominator analysis should be invalidated as well.
  if (analyses_to_invalidate & kAnalysisCFG) {
    analyses_to_invalidate |= kAnalysisDominatorAnalysis;
  }

  if (analyses_to_invalidate & kAnalysisDefUse) {
    def_use_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisInstrToBlockMapping) {
    instr_to_block_.clear();
  }
  if (analyses_to_invalidate & kAnalysisDecorations) {
    decoration_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisCombinators) {
    combinator_ops_.clear();
  }
  if (analyses_to_invalidate & kAnalysisBuiltinVarId) {
    builtin_var_id_map_.clear();
  }
  if (analyses_to_invalidate & kAnalysisCFG) {
    cfg_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisDominatorAnalysis) {
    dominator_trees_.clear();
    post_dominator_trees_.clear();
  }
  if (analyses_to_invalidate & kAnalysisNameMap) {
    id_to_name_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisValueNumberTable) {
    vn_table_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisStructuredCFG) {
    struct_cfg_analysis_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisIdToFuncMapping) {
    id_to_func_.clear();
  }
  if (analyses_to_invalidate & kAnalysisConstants) {
    constant_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisLiveness) {
    liveness_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisTypes) {
    type_mgr_.reset(nullptr);
  }

  if (analyses_to_invalidate & kAnalysisDebugInfo) {
    debug_info_mgr_.reset(nullptr);
  }

  valid_analyses_ = Analysis(valid_analyses_ & ~analyses_to_invalidate);
}